

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,char_const(&)[24],kj::ArrayPtr<char>&,kj::ArrayPtr<unsigned_char>>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          char (*params) [24],ArrayPtr<char> *params_1,ArrayPtr<unsigned_char> *params_2)

{
  char *__src;
  size_t size;
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  ArrayPtr<unsigned_char> *extraout_RDX;
  ArrayPtr<unsigned_char> *extraout_RDX_00;
  ArrayPtr<unsigned_char> *params_00;
  long lVar4;
  String argValues [3];
  String *pSVar5;
  undefined8 uVar6;
  String local_78;
  String local_60;
  String local_48;
  
  this->exception = (Exception *)0x0;
  str<char_const(&)[24]>(&local_78,(kj *)params,(char (*) [24])CONCAT44(in_register_00000014,line));
  __src = params_1->ptr;
  size = params_1->size_;
  heapString(&local_60,size);
  params_00 = extraout_RDX;
  if (size != 0) {
    if ((char *)local_60.content.size_ != (char *)0x0) {
      local_60.content.size_ = (size_t)local_60.content.ptr;
    }
    memcpy((void *)local_60.content.size_,__src,size);
    params_00 = extraout_RDX_00;
  }
  str<kj::ArrayPtr<unsigned_char>&>(&local_48,(kj *)params_2,params_00);
  pSVar5 = &local_78;
  uVar6 = 3;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,pSVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}